

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FStateDefine,_FStateDefine>::DoCopy
          (TArray<FStateDefine,_FStateDefine> *this,TArray<FStateDefine,_FStateDefine> *other)

{
  uint *puVar1;
  TArray<FStateDefine,_FStateDefine> *this_00;
  uint uVar2;
  FStateDefine *pFVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = other->Count;
  this->Count = uVar2;
  this->Most = uVar2;
  if ((ulong)uVar2 == 0) {
    this->Array = (FStateDefine *)0x0;
  }
  else {
    pFVar3 = (FStateDefine *)
             M_Malloc_Dbg((ulong)uVar2 * 0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                          ,0x19e);
    this->Array = pFVar3;
    if (this->Count != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        puVar1 = (uint *)((long)&(other->Array->Label).Index + lVar5);
        this_00 = (TArray<FStateDefine,_FStateDefine> *)
                  ((long)&(this->Array->Children).Array + lVar5);
        this_00[-1].Most = *puVar1;
        DoCopy(this_00,(TArray<FStateDefine,_FStateDefine> *)(puVar1 + 2));
        *(char *)&this_00[1].Most = (char)puVar1[8];
        this_00[1].Array = *(FStateDefine **)(puVar1 + 6);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar4 < this->Count);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}